

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_remove(pfx_table *pfx_table,pfx_record *record)

{
  node_data *data;
  int iVar1;
  trie_node *root_node;
  trie_node *ptVar2;
  data_elem *pdVar3;
  long in_FS_OFFSET;
  node_data *ndata;
  data_elem *elem;
  trie_node *node;
  trie_node *root;
  pfx_record *record_local;
  pfx_table *pfx_table_local;
  _Bool local_15;
  uint index;
  _Bool found;
  long lStack_10;
  uint lvl;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&pfx_table->lock);
  root_node = pfx_table_get_root(pfx_table,(record->prefix).ver);
  index = 0;
  ptVar2 = trie_lookup_exact(root_node,&record->prefix,record->min_len,&index,&local_15);
  if ((local_15 & 1U) == 0) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
    pfx_table_local._0_4_ = -3;
  }
  else {
    pdVar3 = pfx_table_find_elem((node_data *)ptVar2->data,record,
                                 (uint *)((long)&pfx_table_local + 4));
    if (pdVar3 == (data_elem *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
      pfx_table_local._0_4_ = -3;
    }
    else {
      data = (node_data *)ptVar2->data;
      iVar1 = pfx_table_del_elem(data,pfx_table_local._4_4_);
      if (iVar1 == -1) {
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        pfx_table_local._0_4_ = -1;
      }
      else {
        if (data->len == 0) {
          ptVar2 = trie_remove(ptVar2,&record->prefix,record->min_len,index);
          if (ptVar2 == (trie_node *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                          ,0x12e,
                          "int pfx_table_remove(struct pfx_table *, const struct pfx_record *)");
          }
          if (ptVar2 == root_node) {
            if ((record->prefix).ver == LRTR_IPV4) {
              pfx_table->ipv4 = (trie_node *)0x0;
            }
            else {
              pfx_table->ipv6 = (trie_node *)0x0;
            }
          }
          if (*ptVar2->data != 0) {
            __assert_fail("((struct node_data *)node->data)->len == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                          ,0x136,
                          "int pfx_table_remove(struct pfx_table *, const struct pfx_record *)");
          }
          lrtr_free(ptVar2->data);
          lrtr_free(ptVar2);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        pfx_table_notify_clients(pfx_table,record,false);
        pfx_table_local._0_4_ = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return (int)pfx_table_local;
}

Assistant:

RTRLIB_EXPORT int pfx_table_remove(struct pfx_table *pfx_table, const struct pfx_record *record)
{
	pthread_rwlock_wrlock(&(pfx_table->lock));
	struct trie_node *root = pfx_table_get_root(pfx_table, record->prefix.ver);

	unsigned int lvl = 0; // tree depth were node was found
	bool found;
	struct trie_node *node = trie_lookup_exact(root, &(record->prefix), record->min_len, &lvl, &found);

	if (!found) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_RECORD_NOT_FOUND;
	}

	unsigned int index;
	struct data_elem *elem = pfx_table_find_elem(node->data, record, &index);

	if (!elem) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_RECORD_NOT_FOUND;
	}

	struct node_data *ndata = (struct node_data *)node->data;

	if (pfx_table_del_elem(ndata, index) == PFX_ERROR) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_ERROR;
	}

	if (ndata->len == 0) {
		node = trie_remove(node, &(record->prefix), record->min_len, lvl);
		assert(node);

		if (node == root) {
			if (record->prefix.ver == LRTR_IPV4)
				pfx_table->ipv4 = NULL;
			else
				pfx_table->ipv6 = NULL;
		}
		assert(((struct node_data *)node->data)->len == 0);
		lrtr_free(node->data);
		lrtr_free(node);
	}
	pthread_rwlock_unlock(&pfx_table->lock);

	pfx_table_notify_clients(pfx_table, record, false);

	return PFX_SUCCESS;
}